

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testHasVolume<Imath_3_2::Vec4<float>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  float *pfVar5;
  char *in_RDI;
  Box<Imath_3_2::Vec4<float>_> b_2;
  Vec4<float> max;
  Vec4<float> min;
  Box<Imath_3_2::Vec4<float>_> b1;
  int hi;
  int lo;
  uint i;
  Vec4<float> p1;
  Vec4<float> p0;
  Box<Imath_3_2::Vec4<float>_> b0;
  Box<Imath_3_2::Vec4<float>_> b_1;
  Box<Imath_3_2::Vec4<float>_> b;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  Box<Imath_3_2::Vec4<float>_> *in_stack_fffffffffffffef0;
  Box<Imath_3_2::Vec4<float>_> *in_stack_ffffffffffffff00;
  Vec4<float> local_f4;
  Vec4<float> local_e4 [3];
  int local_b4;
  int local_b0;
  uint local_ac;
  Vec4<float> local_a8;
  Vec4<float> local_98;
  Vec4<float> local_88;
  Vec4<float> local_78 [7];
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    hasVolume() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec4<float>_>::Box
            ((Box<Imath_3_2::Vec4<float>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::hasVolume
                    ((Box<Imath_3_2::Vec4<float>_> *)
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x34f,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_3_2::Vec4<float>]"
                 );
  }
  Imath_3_2::Box<Imath_3_2::Vec4<float>_>::Box
            ((Box<Imath_3_2::Vec4<float>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  Imath_3_2::Box<Imath_3_2::Vec4<float>_>::makeInfinite(in_stack_ffffffffffffff00);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::hasVolume
                    ((Box<Imath_3_2::Vec4<float>_> *)
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (!bVar1) {
    __assert_fail("b.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x358,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_3_2::Vec4<float>]"
                 );
  }
  Imath_3_2::Vec4<float>::Vec4(local_78,-1.0);
  Imath_3_2::Vec4<float>::Vec4(&local_88,1.0);
  Imath_3_2::Box<Imath_3_2::Vec4<float>_>::Box
            (in_stack_fffffffffffffef0,
             (Vec4<float> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (Vec4<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::hasVolume
                    ((Box<Imath_3_2::Vec4<float>_> *)
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (!bVar1) {
    __assert_fail("b0.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x363,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_3_2::Vec4<float>]"
                 );
  }
  Imath_3_2::Vec4<float>::Vec4(&local_98);
  Imath_3_2::Vec4<float>::Vec4(&local_a8);
  local_ac = 0;
  while( true ) {
    uVar3 = local_ac;
    uVar2 = Imath_3_2::Vec4<float>::dimensions();
    if (uVar2 <= uVar3) break;
    local_b0 = 1 << ((char)local_ac + 1U & 0x1f);
    uVar3 = Imath_3_2::Vec4<float>::dimensions();
    local_b4 = 1 << ((char)uVar3 - (char)local_ac & 0x1fU);
    in_stack_fffffffffffffee0 = -(float)local_b0;
    pfVar5 = Imath_3_2::Vec4<float>::operator[](&local_98,local_ac);
    *pfVar5 = in_stack_fffffffffffffee0;
    in_stack_fffffffffffffee4 = (float)local_b4;
    pfVar5 = Imath_3_2::Vec4<float>::operator[](&local_a8,local_ac);
    *pfVar5 = in_stack_fffffffffffffee4;
    local_ac = local_ac + 1;
  }
  Imath_3_2::Box<Imath_3_2::Vec4<float>_>::Box
            (in_stack_fffffffffffffef0,(Vec4<float> *)CONCAT44(in_stack_fffffffffffffeec,uVar3),
             (Vec4<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::hasVolume
                    ((Box<Imath_3_2::Vec4<float>_> *)CONCAT44(in_stack_fffffffffffffeec,uVar3));
  if (!bVar1) {
    __assert_fail("b1.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x36f,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_3_2::Vec4<float>]"
                 );
  }
  Imath_3_2::Vec4<float>::Vec4(local_e4,0.0);
  Imath_3_2::Vec4<float>::Vec4(&local_f4,local_e4);
  uVar2 = Imath_3_2::Vec4<float>::dimensions();
  pfVar5 = Imath_3_2::Vec4<float>::operator[](&local_f4,uVar2 - 1);
  *pfVar5 = 2.0;
  Imath_3_2::Box<Imath_3_2::Vec4<float>_>::Box
            (in_stack_fffffffffffffef0,(Vec4<float> *)CONCAT44(in_stack_fffffffffffffeec,uVar3),
             (Vec4<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::hasVolume
                    ((Box<Imath_3_2::Vec4<float>_> *)CONCAT44(in_stack_fffffffffffffeec,uVar3));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x380,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_3_2::Vec4<float>]"
                 );
  }
  return;
}

Assistant:

void
testHasVolume (const char* type)
{
    cout << "    hasVolume() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert (!b.hasVolume ());
    }

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite ();
        assert (b.hasVolume ());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0 (T (-1), T (1));
        assert (b0.hasVolume ());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            int lo = 1 << (i + 1);
            int hi = 1 << (T::dimensions () - i);
            p0[i] = -static_cast<typename T::BaseType>(lo);
            p1[i] = static_cast<typename T::BaseType>(hi);
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
        assert (b1.hasVolume ());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min (0);
        T max                     = min;
        max[T::dimensions () - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b (min, max);

        assert (!b.hasVolume ());
    }
}